

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.h
# Opt level: O0

char * rapidjson::internal::WriteExponent(int K,char *buffer)

{
  char *pcVar1;
  char *in_RSI;
  int in_EDI;
  char *d_1;
  char *d;
  char *local_10;
  int local_4;
  
  local_10 = in_RSI;
  local_4 = in_EDI;
  if (in_EDI < 0) {
    local_10 = in_RSI + 1;
    *in_RSI = '-';
    local_4 = -in_EDI;
  }
  if (local_4 < 100) {
    if (local_4 < 10) {
      *local_10 = (char)local_4 + '0';
      local_10 = local_10 + 1;
    }
    else {
      pcVar1 = GetDigitsLut();
      *local_10 = pcVar1[local_4 << 1];
      local_10[1] = (pcVar1 + (local_4 << 1))[1];
      local_10 = local_10 + 2;
    }
  }
  else {
    *local_10 = (char)(local_4 / 100) + '0';
    pcVar1 = GetDigitsLut();
    local_10[1] = pcVar1[local_4 % 100 << 1];
    local_10[2] = (pcVar1 + (local_4 % 100 << 1))[1];
    local_10 = local_10 + 3;
  }
  return local_10;
}

Assistant:

inline char* WriteExponent(int K, char* buffer) {
    if (K < 0) {
        *buffer++ = '-';
        K = -K;
    }

    if (K >= 100) {
        *buffer++ = static_cast<char>('0' + static_cast<char>(K / 100));
        K %= 100;
        const char* d = GetDigitsLut() + K * 2;
        *buffer++ = d[0];
        *buffer++ = d[1];
    }
    else if (K >= 10) {
        const char* d = GetDigitsLut() + K * 2;
        *buffer++ = d[0];
        *buffer++ = d[1];
    }
    else
        *buffer++ = static_cast<char>('0' + static_cast<char>(K));

    return buffer;
}